

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

Expression * __thiscall rsg::AssignOp::createNextChild(AssignOp *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  Scalar *pSVar1;
  Expression *pEVar2;
  Scalar *pSVar3;
  
  if (this->m_lvalueExpr == (Expression *)0x0) {
    pSVar1 = (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar1 == (this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar1 = (Scalar *)0x0;
    }
    if (pSVar3 == (this->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    valueRange.m_min = pSVar1;
    valueRange.m_type = &(this->m_valueRange).m_type;
    valueRange.m_max = pSVar3;
    pEVar2 = Expression::createRandomLValue(state,valueRange);
    this->m_lvalueExpr = pEVar2;
  }
  else if (this->m_rvalueExpr == (Expression *)0x0) {
    pSVar1 = (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar1 == (this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar1 = (Scalar *)0x0;
    }
    if (pSVar3 == (this->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    valueRange_00.m_min = pSVar1;
    valueRange_00.m_type = &(this->m_valueRange).m_type;
    valueRange_00.m_max = pSVar3;
    pEVar2 = Expression::createRandom(state,valueRange_00);
    this->m_rvalueExpr = pEVar2;
  }
  else {
    pEVar2 = (Expression *)0x0;
  }
  return pEVar2;
}

Assistant:

Expression* AssignOp::createNextChild (GeneratorState& state)
{
	if (m_lvalueExpr == DE_NULL)
	{
		// Construct lvalue
		// \todo [2011-03-14 pyry] Proper l-value generation:
		//  - pure L-value part is generated first
		//  - variable valuerange is made unbound
		//  - R-value is generated
		//  - R-values in L-value are generated
		m_lvalueExpr = Expression::createRandomLValue(state, m_valueRange.asAccess());
		return m_lvalueExpr;
	}
	else if (m_rvalueExpr == DE_NULL)
	{
		// Construct value expr
		m_rvalueExpr = Expression::createRandom(state, m_valueRange.asAccess());
		return m_rvalueExpr;
	}
	else
		return DE_NULL;
}